

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::drawAsPrimitives<(rr::PrimitiveType)9>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,int numVertices,DrawContext *drawContext,
               VertexPacketAllocator *vpalloc)

{
  pointer __n;
  undefined1 local_90 [8];
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> basePrimitives;
  allocator<rr::pa::TriangleAdjacency> local_59;
  undefined1 local_58 [8];
  vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> inputPrimitives;
  size_t assemblerPrimitiveCount;
  DrawContext *drawContext_local;
  int numVertices_local;
  VertexPacket **vertices_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  __n = (pointer)pa::TrianglesAdjacency::getPrimitiveCount((long)numVertices);
  inputPrimitives.
  super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<rr::pa::TriangleAdjacency>::allocator(&local_59);
  std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::vector
            ((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *)
             local_58,(size_type)__n,&local_59);
  std::allocator<rr::pa::TriangleAdjacency>::~allocator(&local_59);
  basePrimitives.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
                begin((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       *)local_58);
  pa::TrianglesAdjacency::
  exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
            ((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
              )basePrimitives.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,vertices,(long)numVertices,
             state->provokingVertexConvention);
  if (program->geometryShader == (GeometryShader *)0x0) {
    std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
              ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)local_90);
    convertPrimitiveToBaseType
              ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)local_90,
               (vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *)
               local_58);
    rr::(anonymous_namespace)::
    makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
              ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)local_90,vpalloc);
    rr::(anonymous_namespace)::
    generatePrimitiveIDs<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
              ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)local_90,drawContext);
    rr::(anonymous_namespace)::
    drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
              (state,renderTarget,program,
               (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)local_90,vpalloc);
    std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::~vector
              ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)local_90);
  }
  else {
    drawWithGeometryShader<(rr::PrimitiveType)9>
              (state,renderTarget,program,
               (vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *)
               local_58,drawContext);
  }
  std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::~vector
            ((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *)
             local_58);
  return;
}

Assistant:

void drawAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, int numVertices, DrawContext& drawContext, VertexPacketAllocator& vpalloc)
{
	// Assemble primitives (deconstruct stips & loops)
	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::Type>		inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, (size_t)numVertices, state.provokingVertexConvention);

	// Tesselate
	//if (state.tesselation)
	//	primList = state.tesselation.exec(primList);

	// Geometry shader
	if (program.geometryShader)
	{
		// If there is an active geometry shader, it will convert any primitive type to basic types
		drawWithGeometryShader<DrawPrimitiveType>(state, renderTarget, program, inputPrimitives, drawContext);
	}
	else
	{
		std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType> basePrimitives;

		// convert types from X_adjacency to X
		convertPrimitiveToBaseType(basePrimitives, inputPrimitives);

		// Make shared vertices distinct. Needed for that the translation to screen space happens only once per vertex, and for flatshading
		makeSharedVerticesDistinct(basePrimitives, vpalloc);

		// A primitive ID will be generated even if no geometry shader is active
		generatePrimitiveIDs(basePrimitives, drawContext);

		// Draw as a basic type
		drawBasicPrimitives(state, renderTarget, program, basePrimitives, vpalloc);
	}
}